

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

void __thiscall wasm::Flow::Flow(Flow *this,Literal *value)

{
  initializer_list<wasm::Literal> init;
  bool bVar1;
  Literal *local_78;
  undefined8 local_28;
  undefined8 local_20;
  Type local_18;
  Literal *value_local;
  Flow *this_local;
  
  local_18.id = (uintptr_t)value;
  value_local = (Literal *)this;
  ::wasm::Literal::Literal((Literal *)&stack0xffffffffffffffc0,value);
  local_28 = &stack0xffffffffffffffc0;
  local_20 = (char *)0x1;
  init._M_len = 1;
  init._M_array = (iterator)local_28;
  Literals::Literals(&this->values,init);
  local_78 = (Literal *)&stack0xffffffffffffffd8;
  do {
    local_78 = local_78 + -1;
    ::wasm::Literal::~Literal(local_78);
  } while (local_78 != (Literal *)&stack0xffffffffffffffc0);
  Name::Name(&this->breakTo);
  bVar1 = Type::isConcrete(&value->type);
  if (!bVar1) {
    __assert_fail("value.type.isConcrete()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                  ,0x45,"wasm::Flow::Flow(Literal)");
  }
  return;
}

Assistant:

Flow(Literal value) : values{value} { assert(value.type.isConcrete()); }